

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

TypedDeleter<LLVMBC::BinaryOperator> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::BinaryOperator>,LLVMBC::BinaryOperator*&>
          (LLVMContext *this,BinaryOperator **u)

{
  TypedDeleter<LLVMBC::BinaryOperator> *this_00;
  TypedDeleter<LLVMBC::BinaryOperator> *t;
  TypedDeleter<LLVMBC::BinaryOperator> *mem;
  BinaryOperator **u_local;
  LLVMContext *this_local;
  
  this_00 = (TypedDeleter<LLVMBC::BinaryOperator> *)allocate(this,0x10,8);
  if (this_00 == (TypedDeleter<LLVMBC::BinaryOperator> *)0x0) {
    std::terminate();
  }
  TypedDeleter<LLVMBC::BinaryOperator>::TypedDeleter(this_00,*u);
  return this_00;
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}